

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpf_reader.cpp
# Opt level: O1

vector<Mirror,_std::allocator<Mirror>_> * __thiscall
RPF_reader::load_rpf
          (vector<Mirror,_std::allocator<Mirror>_> *__return_storage_ptr__,RPF_reader *this,
          string *file_to_read)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  stringstream local_520 [8];
  stringstream ss;
  ostream local_510 [112];
  ios_base local_4a0 [264];
  long local_398;
  ifstream inFile;
  byte abStack_378 [488];
  undefined1 local_190 [8];
  Mirror incomming_mirror;
  Point_d m_position;
  Point_d sample_position;
  Point_d displayed_sample;
  string line;
  vector<Point_d,_std::allocator<Point_d>_> sampled_positions;
  int local_68;
  int local_64;
  int id;
  int sample_amount;
  string keyword;
  undefined1 local_34;
  
  std::ifstream::ifstream(&local_398);
  displayed_sample._24_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._8_8_ = 0;
  sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keyword.field_2._8_8_ = __return_storage_ptr__;
  Point_d::Point_d((Point_d *)
                   &incomming_mirror._disp_pixels.
                    super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,999999.0,99999.0,99999.0,9999999);
  Point_d::Point_d((Point_d *)&m_position.id,999999.0,99999.0,99999.0,9999999);
  std::ifstream::open((string *)&local_398,(_Ios_Openmode)file_to_read);
  if ((abStack_378[*(long *)(local_398 + -0x18)] & 5) == 0) {
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_398 + -0x18) + (char)(string *)&local_398)
      ;
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_398,(string *)&displayed_sample.id,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream(local_520);
      _id = &keyword._M_string_length;
      keyword._M_dataplus._M_p = (pointer)0x0;
      keyword._M_string_length._0_1_ = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_510,(char *)displayed_sample._24_8_,(long)line._M_dataplus._M_p);
      std::operator>>((istream *)local_520,(string *)&id);
      iVar2 = std::__cxx11::string::compare((char *)&id);
      if (iVar2 == 0) {
        std::istream::operator>>((istream *)local_520,&local_68);
      }
      iVar2 = std::__cxx11::string::compare((char *)&id);
      if (iVar2 == 0) {
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
      }
      Point_d::Point_d((Point_d *)&sample_position.id,999999.0,99999.0,99999.0,9999999);
      iVar2 = std::__cxx11::string::compare((char *)&id);
      local_34 = 1;
      if (iVar2 == 0) {
        std::istream::operator>>((istream *)local_520,(int *)&displayed_sample.dis);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        if (((double)CONCAT44(displayed_sample.y._4_4_,displayed_sample.y._0_4_) == 99999.0) &&
           (!NAN((double)CONCAT44(displayed_sample.y._4_4_,displayed_sample.y._0_4_)))) {
          local_34 = 0;
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)&id);
      if (iVar2 == 0) {
        std::istream::operator>>((istream *)local_520,&local_64);
      }
      iVar2 = std::__cxx11::string::compare((char *)&id);
      if (iVar2 == 0) {
        std::istream::operator>>((istream *)local_520,(int *)&sample_position.dis);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        if (sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<Point_d,std::allocator<Point_d>>::_M_realloc_insert<Point_d_const&>
                    ((vector<Point_d,std::allocator<Point_d>> *)(line.field_2._M_local_buf + 8),
                     (iterator)0x0,(Point_d *)&m_position.id);
        }
        else {
          (sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
           super__Vector_impl_data._M_start)->dis = sample_position.y;
          *(double *)
           &(sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
             super__Vector_impl_data._M_start)->id = sample_position.dis;
          (sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
           super__Vector_impl_data._M_start)->x = (double)m_position._24_8_;
          (sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
           super__Vector_impl_data._M_start)->y = sample_position.x;
          sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
          super__Vector_impl_data._M_start =
               sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)&id);
      if (iVar2 == 0) {
        Point_d::Point_d((Point_d *)&incomming_mirror,999999.0,99999.0,99999.0,9999999);
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        incomming_mirror._position.id = 0;
        incomming_mirror._position._28_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        Point_d::Point_d((Point_d *)&incomming_mirror._ammount_of_matching_samples,999999.0,99999.0,
                         99999.0,9999999);
        incomming_mirror._displayed_sample.id._0_1_ = 0;
        incomming_mirror.has_sample = false;
        incomming_mirror._105_3_ = 0;
        incomming_mirror._am_disp_pixels = 0;
        incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_190._0_4_ = local_68;
        incomming_mirror._position._12_8_ = m_position._12_8_;
        incomming_mirror._0_8_ =
             incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        incomming_mirror._ammount_of_matching_samples = sample_position.id;
        incomming_mirror._68_4_ = sample_position._28_4_;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_64;
        std::vector<Point_d,_std::allocator<Point_d>_>::operator=
                  ((vector<Point_d,_std::allocator<Point_d>_> *)&incomming_mirror._position.id,
                   (vector<Point_d,_std::allocator<Point_d>_> *)((long)&line.field_2 + 8));
        incomming_mirror._displayed_sample.id._0_1_ = local_34;
        std::vector<Mirror,_std::allocator<Mirror>_>::push_back
                  ((vector<Mirror,_std::allocator<Mirror>_> *)keyword.field_2._8_8_,
                   (value_type *)local_190);
        if (incomming_mirror._104_8_ != 0) {
          operator_delete((void *)incomming_mirror._104_8_,
                          (long)incomming_mirror._disp_pixels.
                                super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
                                super__Vector_impl_data._M_finish - incomming_mirror._104_8_);
        }
        if (incomming_mirror._position._24_8_ != 0) {
          operator_delete((void *)incomming_mirror._position._24_8_,
                          CONCAT44(incomming_mirror._matching_samples.
                                   super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                                   super__Vector_impl_data._M_finish._4_4_,
                                   incomming_mirror._matching_samples.
                                   super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                                   super__Vector_impl_data._M_finish._0_4_) -
                          incomming_mirror._position._24_8_);
        }
      }
      if (_id != &keyword._M_string_length) {
        operator_delete(_id,CONCAT71(keyword._M_string_length._1_7_,
                                     (undefined1)keyword._M_string_length) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_520);
      std::ios_base::~ios_base(local_4a0);
    }
    if (line.field_2._8_8_ != 0) {
      operator_delete((void *)line.field_2._8_8_,-line.field_2._8_8_);
    }
    if ((size_type *)displayed_sample._24_8_ != &line._M_string_length) {
      operator_delete((void *)displayed_sample._24_8_,
                      CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1);
    }
    std::ifstream::~ifstream(&local_398);
    return (vector<Mirror,_std::allocator<Mirror>_> *)keyword.field_2._8_8_;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unable to open file ",0x14);
  std::operator<<((ostream *)&std::cerr,(string *)file_to_read);
  exit(1);
}

Assistant:

std::vector<Mirror> RPF_reader::load_rpf(std::string const& file_to_read){
    std::ifstream inFile;
    std::string line;
    std::vector<Mirror> loadedMirrors;
    std::vector<Point_d> sampled_positions;
    Point_d m_position;
    Point_d sample_position;


    inFile.open(file_to_read);
    if (!inFile) {
        std::cerr << "Unable to open file "<<file_to_read;
        exit(1);   // call system to stop
    }
    else{
      while(std::getline(inFile, line)){

        std::stringstream ss;
        std::string keyword;


        //------------------------------------------------------
        //------------------------------------------------------
  /*
        int id;
        Point_d _position;
        std::vector<Point_d> _matching_samples;
        // value ammount of _matching_samples  not used???
        int _ammount_of_matching_samples = 0;
        Point_d _displayed_sample;
        bool has_sample = false;
        */
        //------------------------------------------------------
        //------------------------------------------------------

        ss << line;
        ss >> keyword;


        int id;

        if(keyword == "m_id"){
    //    std::cout <<"keyword: m_id " << '\n';
          ss >> id;

        }

        if(keyword == "m_pos"){
    //    std::cout <<"keyword: m_pos " << '\n';

          ss >> m_position.x;
          ss >> m_position.y;
          ss >> m_position.dis;

        }
        //std::cout <<"keyword: m_pos.y "<< m_position.y << '\n';


        Point_d displayed_sample;
        bool displayed = true;

        if(keyword == "dis_sample"){
    //      std::cout <<"keyword: displayed_sample " << '\n';

          ss >> displayed_sample.id;
          ss >> displayed_sample.x;
          ss >> displayed_sample.y;
          ss >> displayed_sample.dis;
          if(displayed_sample.dis == 99999){
            displayed = false;
          }
        }

        int sample_amount;

        if(keyword == "sample_amount"){
  //        std::cout <<"keyword: sample_ammount " << '\n';

          ss >> sample_amount;
        }

        if(keyword == "pos"){
    //      std::cout <<"keyword: pos " << '\n';


          ss >> sample_position.id;
          ss >> sample_position.x;
          ss >> sample_position.y;
          ss >> sample_position.dis;

          sampled_positions.push_back(sample_position);

        }

        if(keyword == "---"){
    //      std::cout <<"keyword: --- " << '\n';

          Mirror incomming_mirror;

          incomming_mirror.id = id;
          incomming_mirror._position = m_position;
          incomming_mirror._displayed_sample = displayed_sample;
          incomming_mirror._ammount_of_matching_samples = sample_amount;
          incomming_mirror._matching_samples = sampled_positions;
          incomming_mirror.has_sample = displayed;

          loadedMirrors.push_back(incomming_mirror);

        }
      }
    }
    return loadedMirrors;
  }